

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MockParameterTest_outputParameterTraced_TestShell::createTest
          (TEST_MockParameterTest_outputParameterTraced_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
                                  ,0x33c);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_002d9b98;
  return this_00;
}

Assistant:

TEST(MockParameterTest, outputParameterTraced)
{
    mock().tracing(true);

    int param = 1;
    mock().actualCall("someFunc").withOutputParameter("someParameter", &param);
    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc someParameter:", mock().getTraceOutput());

    mock().checkExpectations();
}